

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall cmCTestP4::DescribeParser::DoHeaderLine(DescribeParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  cmCTestP4 *this_00;
  bool bVar3;
  User user;
  string local_c8;
  User local_a8;
  
  bVar3 = cmsys::RegularExpression::find
                    (&this->RegexHeader,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexHeader).regmatch);
  if (bVar3) {
    pcVar2 = (this->RegexHeader).regmatch.startp[1];
    paVar1 = &local_a8.UserName.field_2;
    local_a8.UserName._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar2 == (char *)0x0) {
      local_a8.UserName._M_string_length = 0;
      local_a8.UserName.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,pcVar2,(this->RegexHeader).regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.UserName._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.UserName._M_dataplus._M_p,
                      CONCAT71(local_a8.UserName.field_2._M_allocated_capacity._1_7_,
                               local_a8.UserName.field_2._M_local_buf[0]) + 1);
    }
    pcVar2 = (this->RegexHeader).regmatch.startp[4];
    if (pcVar2 == (char *)0x0) {
      local_a8.UserName._M_string_length = 0;
      local_a8.UserName.field_2._M_local_buf[0] = '\0';
      local_a8.UserName._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a8.UserName._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,pcVar2,(this->RegexHeader).regmatch.endp[4]);
    }
    std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.UserName._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.UserName._M_dataplus._M_p,
                      CONCAT71(local_a8.UserName.field_2._M_allocated_capacity._1_7_,
                               local_a8.UserName.field_2._M_local_buf[0]) + 1);
    }
    this_00 = this->P4;
    pcVar2 = (this->RegexHeader).regmatch.startp[2];
    if (pcVar2 == (char *)0x0) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,pcVar2,(this->RegexHeader).regmatch.endp[2]);
    }
    GetUserData(&local_a8,this_00,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_assign((string *)&(this->Rev).Author);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).EMail);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).Committer);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).CommitterEMail);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).CommitDate);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.AccessTime._M_dataplus._M_p != &local_a8.AccessTime.field_2) {
      operator_delete(local_a8.AccessTime._M_dataplus._M_p,
                      local_a8.AccessTime.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.EMail._M_dataplus._M_p != &local_a8.EMail.field_2) {
      operator_delete(local_a8.EMail._M_dataplus._M_p,
                      local_a8.EMail.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.Name._M_dataplus._M_p != &local_a8.Name.field_2) {
      operator_delete(local_a8.Name._M_dataplus._M_p,local_a8.Name.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.UserName._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.UserName._M_dataplus._M_p,
                      CONCAT71(local_a8.UserName.field_2._M_allocated_capacity._1_7_,
                               local_a8.UserName.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void DoHeaderLine()
  {
    if (this->RegexHeader.find(this->Line)) {
      this->Rev.Rev = this->RegexHeader.match(1);
      this->Rev.Date = this->RegexHeader.match(4);

      cmCTestP4::User user = P4->GetUserData(this->RegexHeader.match(2));
      this->Rev.Author = user.Name;
      this->Rev.EMail = user.EMail;

      this->Rev.Committer = this->Rev.Author;
      this->Rev.CommitterEMail = this->Rev.EMail;
      this->Rev.CommitDate = this->Rev.Date;
    }
  }